

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::build_accel(PathTracer *this)

{
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
  __last;
  Primitive *pPVar3;
  BVHNode *this_00;
  const_iterator in_RDI;
  BVHAccel *this_01;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *this_02;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *obj_prims;
  SceneObject *obj;
  iterator __end1;
  iterator __begin1;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  *__range1;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  primitives;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *in_stack_fffffffffffffef8;
  value_type *__x;
  Timer *in_stack_ffffffffffffff00;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *in_stack_ffffffffffffff10;
  undefined8 *max_leaf_size;
  size_type in_stack_ffffffffffffff28;
  FILE *pFVar4;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff40;
  __normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
  __first;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  local_60;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *local_48;
  SceneObject *local_40;
  SceneObject **local_38;
  __normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
  local_30;
  Primitive *local_28;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  local_20;
  
  fprintf(_stdout,"[PathTracer] Collecting primitives... ");
  fflush(_stdout);
  Timer::start(in_stack_ffffffffffffff00);
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  vector((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *)0x254f81);
  local_28 = in_RDI._M_current[1];
  local_30._M_current =
       (SceneObject **)
       std::
       vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
       ::begin((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                *)in_stack_fffffffffffffef8);
  local_38 = (SceneObject **)
             std::
             vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
             ::end((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                    *)in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppSVar2;
    (**local_40->_vptr_SceneObject)(&local_60);
    local_48 = &local_60;
    __first._M_current = (Primitive **)&local_20;
    __last._M_current =
         (Primitive **)
         std::
         vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
         ::size((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                 *)__first._M_current);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::size(local_48);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::reserve(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::end(in_stack_fffffffffffffef8);
    __gnu_cxx::
    __normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>
    ::__normal_iterator<CMU462::StaticScene::Primitive**>
              ((__normal_iterator<CMU462::StaticScene::Primitive_*const_*,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
                *)in_stack_ffffffffffffff00,
               (__normal_iterator<CMU462::StaticScene::Primitive_**,_std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>_>
                *)in_stack_fffffffffffffef8);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::begin(in_stack_fffffffffffffef8);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::end(in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff40 =
         std::
         vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>::
         insert<__gnu_cxx::__normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>,void>
                   (in_stack_ffffffffffffff40._M_current,in_RDI,__first,__last);
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::~vector(in_stack_ffffffffffffff10);
    __gnu_cxx::
    __normal_iterator<CMU462::StaticScene::SceneObject_**,_std::vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>_>
    ::operator++(&local_30);
  }
  Timer::stop(in_stack_ffffffffffffff00);
  pFVar4 = _stdout;
  this_01 = (BVHAccel *)Timer::duration(in_stack_ffffffffffffff00);
  fprintf(pFVar4,"Done! (%.4f sec)\n",this_01);
  max_leaf_size = (undefined8 *)&stdout;
  fprintf(_stdout,"[PathTracer] Building BVH... ");
  fflush((FILE *)*max_leaf_size);
  Timer::start(in_stack_ffffffffffffff00);
  pPVar3 = (Primitive *)operator_new(0x28);
  StaticScene::BVHAccel::BVHAccel
            (this_01,(vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                      *)pFVar4,(size_t)max_leaf_size);
  in_RDI._M_current[0xe] = pPVar3;
  Timer::stop(in_stack_ffffffffffffff00);
  pFVar4 = _stdout;
  this_02 = (vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
             *)Timer::duration(in_stack_ffffffffffffff00);
  fprintf(pFVar4,"Done! (%.4f sec)\n",this_02);
  __x = (value_type *)(in_RDI._M_current + 0x2f);
  this_00 = StaticScene::BVHAccel::get_root((BVHAccel *)in_RDI._M_current[0xe]);
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
          *)this_00,__x);
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  ~vector(this_02);
  return;
}

Assistant:

void PathTracer::build_accel() {
  // collect primitives //
  fprintf(stdout, "[PathTracer] Collecting primitives... ");
  fflush(stdout);
  timer.start();
  vector<Primitive *> primitives;
  for (SceneObject *obj : scene->objects) {
    const vector<Primitive *> &obj_prims = obj->get_primitives();
    primitives.reserve(primitives.size() + obj_prims.size());
    primitives.insert(primitives.end(), obj_prims.begin(), obj_prims.end());
  }
  timer.stop();
  fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

  // build BVH //
  fprintf(stdout, "[PathTracer] Building BVH... ");
  fflush(stdout);
  timer.start();
  bvh = new BVHAccel(primitives);
  timer.stop();
  fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

  // initial visualization //
  selectionHistory.push(bvh->get_root());
}